

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O0

ostream * __thiscall
dynamicgraph::TimeDependency<int>::displayDependencies
          (TimeDependency<int> *this,ostream *os,int depth,string *space,string *next1,string *next2
          )

{
  DependencyType DVar1;
  SignalBase<int> *pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  bool *pbVar7;
  undefined4 extraout_var;
  reference ppSVar8;
  char *pcVar9;
  string local_198 [32];
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _Self local_118;
  _List_const_iterator<const_dynamicgraph::SignalBase<int>_*> local_110;
  const_iterator it2;
  string local_100 [8];
  string ajout2;
  string local_d8 [8];
  string ajout;
  const_iterator it;
  const_iterator itend;
  string local_78;
  string local_58;
  string *local_38;
  string *next2_local;
  string *next1_local;
  string *space_local;
  ostream *poStack_18;
  int depth_local;
  ostream *os_local;
  TimeDependency<int> *this_local;
  
  pSVar2 = this->leader;
  local_38 = next2;
  next2_local = next1;
  next1_local = space;
  space_local._4_4_ = depth;
  poStack_18 = os;
  os_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)space);
  std::__cxx11::string::string((string *)&local_78,(string *)next1);
  std::__cxx11::string::string((string *)&itend,(string *)next2);
  poVar6 = SignalBase<int>::displayDependencies
                     (pSVar2,os,depth,&local_58,&local_78,(string *)&itend);
  std::operator<<(poVar6," (");
  std::__cxx11::string::~string((string *)&itend);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  DVar1 = this->dependencyType;
  if (DVar1 == TIME_DEPENDENT) {
    poVar6 = std::operator<<(poStack_18,"t=");
    iVar4 = (*this->leader->_vptr_SignalBase[2])();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)CONCAT44(extraout_var,iVar4));
    poVar6 = std::operator<<(poVar6," (/");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->periodTime);
    std::operator<<(poVar6,") ");
  }
  else if (DVar1 == BOOL_DEPENDENT) {
    poVar6 = std::operator<<(poStack_18,"ready=");
    pbVar7 = SignalBase<int>::getReady(this->leader);
    pcVar9 = "FALSE";
    if ((*pbVar7 & 1U) != 0) {
      pcVar9 = "TRUE";
    }
    std::operator<<(poVar6,pcVar9);
  }
  else if (DVar1 == ALWAYS_READY) {
    std::operator<<(poStack_18,"A");
  }
  std::operator<<(poStack_18,")");
  it = std::__cxx11::
       list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
       ::end(&this->dependencies);
  ajout.field_2._8_8_ =
       std::__cxx11::
       list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
       ::begin(&this->dependencies);
  while( true ) {
    bVar3 = std::operator!=((_Self *)((long)&ajout.field_2 + 8),&it);
    if (!bVar3) {
      return poStack_18;
    }
    if (space_local._4_4_ == 0) break;
    std::ostream::operator<<(poStack_18,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_d8,"|",(allocator<char> *)(ajout2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ajout2.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"|",(allocator<char> *)((long)&it2._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it2._M_node + 7));
    local_110._M_node = (_List_node_base *)ajout.field_2._8_8_;
    std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator++(&local_110);
    local_118._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
         ::end(&this->dependencies);
    bVar3 = std::operator==(&local_110,&local_118);
    if (bVar3) {
      std::__cxx11::string::operator=(local_d8,"`");
      std::__cxx11::string::operator=(local_100," ");
    }
    ppSVar8 = std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator*
                        ((_List_const_iterator<const_dynamicgraph::SignalBase<int>_*> *)
                         ((long)&ajout.field_2 + 8));
    poVar6 = poStack_18;
    pSVar2 = *ppSVar8;
    uVar5 = space_local._4_4_ - 1;
    std::operator+(&local_158,space,next2);
    std::operator+(&local_138,&local_158,"   ");
    std::__cxx11::string::string(local_178,local_d8);
    std::__cxx11::string::string(local_198,local_100);
    (*pSVar2->_vptr_SignalBase[0xb])(pSVar2,poVar6,(ulong)uVar5,&local_138,local_178,local_198);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_d8);
    std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator++
              ((_List_const_iterator<const_dynamicgraph::SignalBase<int>_*> *)
               ((long)&ajout.field_2 + 8));
  }
  poVar6 = (ostream *)std::ostream::operator<<(poStack_18,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,(string *)space);
  std::operator<<(poVar6,"   `-- ...");
  return poStack_18;
}

Assistant:

std::ostream &TimeDependency<Time>::displayDependencies(
    std::ostream &os, const int depth, std::string space, std::string next1,
    std::string next2) const {
  leader.SignalBase<Time>::displayDependencies(os, depth, space, next1, next2)
      << " (";
  switch (dependencyType) {
    case ALWAYS_READY:
      os << "A";
      break;
    case BOOL_DEPENDENT:
      os << "ready=" << ((leader.getReady()) ? "TRUE" : "FALSE");
      break;
    case TIME_DEPENDENT:
      os << "t=" << leader.getTime() << " (/" << periodTime << ") ";
      break;
  };
  os << ")";  //<<std::endl;
  {
    const typename Dependencies::const_iterator itend = dependencies.end();
    for (typename Dependencies::const_iterator it = dependencies.begin();
         it != itend; ++it)
      if (depth != 0) {
        os << std::endl;
        std::string ajout = "|";
        std::string ajout2 = "|";
        typename Dependencies::const_iterator it2 = it;
        ++it2;
        if (it2 == dependencies.end()) {
          ajout = "`";
          ajout2 = " ";
        }
        (*it)->displayDependencies(os, depth - 1, space + next2 + "   ", ajout,
                                   ajout2);
      } else {
        os << std::endl << space << "   `-- ...";
        break;
      }
  }
  return os;
}